

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

void setsvar(char *name,char *str,bool dofunc)

{
  uint uVar1;
  ident *piVar2;
  char *pcVar3;
  identstack *piVar4;
  char *local_20;
  
  local_20 = name;
  piVar2 = hashset<ident>::access<char_const*>(&idents,&local_20);
  if (piVar2 == (ident *)0x0) {
    return;
  }
  if (piVar2->type != 2) {
    return;
  }
  uVar1 = piVar2->flags;
  if ((uVar1 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar1 & 0x10) != 0) {
      if ((piVar2->field_5).stack != (identstack *)0x0) {
        operator_delete__((piVar2->field_5).stack);
        uVar1 = piVar2->flags;
      }
      piVar2->flags = uVar1 & 0xffffffef;
    }
    piVar4 = *(identstack **)(piVar2->field_4).args;
  }
  else {
    if ((uVar1 & 1) != 0) {
      debugcode("cannot override persistent variable %s",piVar2->name);
      return;
    }
    piVar4 = *(identstack **)(piVar2->field_4).args;
    if ((uVar1 & 0x10) == 0) {
      (piVar2->field_5).stack = piVar4;
      piVar2->flags = uVar1 | 0x10;
      goto LAB_0012a857;
    }
  }
  if (piVar4 != (identstack *)0x0) {
    operator_delete__(piVar4);
  }
LAB_0012a857:
  pcVar3 = newstring(str);
  *(char **)(piVar2->field_4).args = pcVar3;
  if ((dofunc) && (piVar2->fun != (identfun)0x0)) {
    (*piVar2->fun)();
  }
  return;
}

Assistant:

void setsvar(const char *name, const char *str, bool dofunc)
{
    _GETVAR(id, ID_SVAR, name, );
    OVERRIDEVAR(return, id->overrideval.s = *id->storage.s, delete[] id->overrideval.s, delete[] *id->storage.s);
    *id->storage.s = newstring(str);
    if(dofunc) id->changed();
}